

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGV.cpp
# Opt level: O3

void __thiscall CGV::visit(CGV *this,FuncDef *node)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  SymbolTable *this_00;
  CodeWriter *pCVar6;
  int iVar7;
  ASTNode *pAVar8;
  ASTNode *this_01;
  string *psVar9;
  deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *pdVar10;
  Function *pFVar11;
  _Elt_pointer ppAVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string __str;
  string funcName;
  string returnType;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pAVar8 = AST::ASTNode::getChild(&node->super_ASTNode,0);
  this_01 = AST::ASTNode::getChild(pAVar8,0);
  psVar9 = AST::ASTNode::getName_abi_cxx11_(this_01);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar5 = (psVar9->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar5,pcVar5 + psVar9->_M_string_length);
  pdVar10 = AST::ASTNode::getChildren(pAVar8);
  ppAVar12 = (pdVar10->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
  if (ppAVar12 ==
      (pdVar10->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppAVar12 = (pdVar10->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl
               .super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  psVar9 = AST::ASTNode::getName_abi_cxx11_(ppAVar12[-1]);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar5 = (psVar9->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar5,pcVar5 + psVar9->_M_string_length);
  this_00 = this->symbolTable;
  pFVar11 = STGV::createTempFunction(&node->super_ASTNode,&local_70,&local_50,(Detector *)0x0);
  pFVar11 = Semantic::SymbolTable::getFreeFunction(this_00,&local_70,pFVar11);
  this->currentFunction = pFVar11;
  pCVar6 = this->writer;
  psVar9 = Function::getTag_abi_cxx11_(pFVar11);
  CodeWriter::tag(pCVar6,psVar9,false);
  pCVar6 = this->writer;
  paVar1 = &local_f0.field_2;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,"Saving values of reserved registers","");
  CodeWriter::comment(pCVar6,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  pCVar6 = this->writer;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"r12","");
  paVar2 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"r15","");
  CodeWriter::saveWord(pCVar6,-4,&local_f0,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  pCVar6 = this->writer;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"r12","");
  local_d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"r14","");
  CodeWriter::saveWord(pCVar6,-8,&local_f0,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  pCVar6 = this->writer;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"r12","");
  local_d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"r12","");
  CodeWriter::saveWord(pCVar6,-0xc,&local_f0,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  pCVar6 = this->writer;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,"Moving stack pointer to the same address as frame pointer","");
  CodeWriter::comment(pCVar6,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  pCVar6 = this->writer;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"subi","");
  local_d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"r14","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"r12","");
  paVar3 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct((ulong)&local_90,'\x02');
  pcVar5 = local_90._M_dataplus._M_p;
  pcVar5[0] = '1';
  pcVar5[1] = '2';
  CodeWriter::OP(pCVar6,&local_f0,&local_d0,&local_b0,&local_90);
  paVar4 = &local_b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar4) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  pAVar8 = AST::ASTNode::getChild(&node->super_ASTNode,1);
  (**pAVar8->_vptr_ASTNode)(pAVar8,this);
  pCVar6 = this->writer;
  psVar9 = Function::getTag_abi_cxx11_(this->currentFunction);
  pcVar5 = (psVar9->_M_dataplus)._M_p;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar5,pcVar5 + psVar9->_M_string_length);
  std::__cxx11::string::append((char *)&local_f0);
  CodeWriter::tag(pCVar6,&local_f0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  pCVar6 = this->writer;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,
             "Moving stack pointer back to its position before function definition","");
  CodeWriter::comment(pCVar6,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  pCVar6 = this->writer;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"addi","");
  local_d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"r12","");
  local_b0._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"r14","");
  local_90._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct((ulong)&local_90,'\x02');
  pcVar5 = local_90._M_dataplus._M_p;
  pcVar5[0] = '1';
  pcVar5[1] = '2';
  CodeWriter::OP(pCVar6,&local_f0,&local_d0,&local_b0,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar4) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  pCVar6 = this->writer;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,
             "setting values of reserved registers to their old values before function definition",
             "");
  CodeWriter::comment(pCVar6,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  pCVar6 = this->writer;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"r15","");
  local_d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"r12","");
  CodeWriter::loadWord(pCVar6,&local_f0,-4,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  pCVar6 = this->writer;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"r14","");
  local_d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"r12","");
  CodeWriter::loadWord(pCVar6,&local_f0,-8,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  pCVar6 = this->writer;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"r12","");
  local_d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"r12","");
  CodeWriter::loadWord(pCVar6,&local_f0,-0xc,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  psVar9 = Function::getReturnType_abi_cxx11_(this->currentFunction);
  iVar7 = std::__cxx11::string::compare((char *)psVar9);
  if (iVar7 != 0) {
    pCVar6 = this->writer;
    local_f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"Loading return value to r1","");
    CodeWriter::comment(pCVar6,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    pCVar6 = this->writer;
    local_f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"r1","");
    local_d0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"r13","");
    CodeWriter::loadWord(pCVar6,&local_f0,-4,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    pCVar6 = this->writer;
    local_f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"r12","");
    local_d0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"r1","");
    CodeWriter::saveWord(pCVar6,-4,&local_f0,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
  }
  pCVar6 = this->writer;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"jr","");
  local_d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"r15","");
  CodeWriter::OP(pCVar6,&local_f0,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CGV::visit(FuncDef *node) {
    auto signature = node->getChild(0);
    std::string funcName = signature->getChild(0)->getName();
    std::string returnType = signature->getChildren().back()->getName();
    currentFunction = symbolTable->getFreeFunction(funcName, STGV::createTempFunction(node, funcName, returnType, nullptr));
    writer->tag(currentFunction->getTag());
    writer->comment("Saving values of reserved registers");
    writer->saveWord(-4, "r12", "r15");
    writer->saveWord(-8, "r12", "r14");
    writer->saveWord(-12, "r12", "r12");
    writer->comment("Moving stack pointer to the same address as frame pointer");
    writer->OP("subi", "r14", "r12", std::to_string(12));
    //calling `funcBody` node
    node->getChild(1)->accept(*this);
    writer->tag(currentFunction->getTag() + "_end");
    writer->comment("Moving stack pointer back to its position before function definition");
    writer->OP("addi", "r12", "r14", std::to_string(12));
    writer->comment("setting values of reserved registers to their old values before function definition");
    writer->loadWord("r15", -4, "r12");
    writer->loadWord("r14", -8, "r12");
    writer->loadWord("r12", -12, "r12");
    if (currentFunction->getReturnType() != "void") {
        writer->comment("Loading return value to r1");
        writer->loadWord("r1", -4, "r13");
        writer->saveWord(-4, "r12", "r1");
    }
    writer->OP("jr", "r15");
}